

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::read_in_particle_samples_mixed_event_gzipped(particleSamples *this)

{
  int iVar1;
  _Ios_Openmode _Var2;
  size_type sVar3;
  void *pvVar4;
  istream *piVar5;
  value_type *__x;
  ulong uVar6;
  long in_RDI;
  particle_info temp_particle_info;
  stringstream temp2;
  int ipart;
  stringstream temp1;
  int num_particles;
  int ievent;
  int temp_monval;
  int n_particle;
  string temp_string;
  uint i;
  istream *in_stack_fffffffffffffb58;
  istream *in_stack_fffffffffffffb60;
  double local_420 [2];
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8 [5];
  stringstream local_3b0 [192];
  gzFile in_stack_fffffffffffffd10;
  particleSamples *in_stack_fffffffffffffd18;
  string local_228 [36];
  int local_204;
  stringstream local_200 [392];
  void *local_78;
  string local_60 [32];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  string local_30 [36];
  uint local_c;
  
  for (local_c = 0; uVar6 = (ulong)local_c,
      sVar3 = std::
              vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
              ::size(*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       **)(in_RDI + 0x698)), uVar6 < sVar3; local_c = local_c + 1) {
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   **)(in_RDI + 0x698),(ulong)local_c);
    std::vector<particle_info,_std::allocator<particle_info>_>::clear
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14e413);
  }
  std::
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  ::clear((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
           *)0x14e437);
  std::__cxx11::string::string(local_30);
  local_3c = 0;
  local_40 = 0;
  while (local_40 < *(int *)(in_RDI + 0x5f0)) {
    gz_readline_abi_cxx11_(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::__cxx11::string::operator=(local_30,local_60);
    std::__cxx11::string::~string(local_60);
    iVar1 = gzeof(*(undefined8 *)(in_RDI + 0x5e8));
    if (iVar1 != 0) break;
    pvVar4 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14e51b);
    local_78 = pvVar4;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffffb60,(value_type *)in_stack_fffffffffffffb58);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_200,local_30,_Var2);
    std::istream::operator>>((istream *)local_200,&local_34);
    for (local_204 = 0; local_204 < local_34; local_204 = local_204 + 1) {
      gz_readline_abi_cxx11_(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      std::__cxx11::string::operator=(local_30,local_228);
      std::__cxx11::string::~string(local_228);
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_3b0,local_30,_Var2);
      std::istream::operator>>((istream *)local_3b0,&local_38);
      piVar5 = (istream *)std::istream::operator>>((istream *)local_3b0,local_420);
      piVar5 = (istream *)std::istream::operator>>(piVar5,local_3d8);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3f0);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3e8);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3e0);
      __x = (value_type *)std::istream::operator>>(piVar5,&local_3f8);
      in_stack_fffffffffffffb60 = (istream *)std::istream::operator>>((istream *)__x,&local_410);
      in_stack_fffffffffffffb58 =
           (istream *)std::istream::operator>>(in_stack_fffffffffffffb60,&local_408);
      std::istream::operator>>(in_stack_fffffffffffffb58,&local_400);
      std::
      vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
      ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                     **)(in_RDI + 0x698),(long)local_3c);
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                ((vector<particle_info,_std::allocator<particle_info>_> *)piVar5,__x);
      std::__cxx11::stringstream::~stringstream(local_3b0);
    }
    local_40 = local_34 + local_40;
    local_3c = local_3c + 1;
    std::__cxx11::stringstream::~stringstream(local_200);
  }
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_mixed_event_gzipped() {
    // clean out the previous record
    for (unsigned int i = 0; i < full_particle_list_mixed_event->size(); i++)
        (*full_particle_list_mixed_event)[i]->clear();
    full_particle_list_mixed_event->clear();

    string temp_string;
    int n_particle;
    int temp_monval;
    int ievent = 0;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        temp_string = gz_readline(inputfile_mixed_event_gz);
        if (gzeof(inputfile_mixed_event_gz)) break;
        full_particle_list_mixed_event->push_back(new vector<particle_info>);
        // get number of particles within the event
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;

        for (int ipart = 0; ipart < n_particle; ipart++) {
            temp_string = gz_readline(inputfile_mixed_event_gz);
            std::stringstream temp2(temp_string);
            temp2 >> temp_monval;

            particle_info temp_particle_info;
            temp_particle_info.monval = temp_monval;
            temp2 >> temp_particle_info.mass >> temp_particle_info.t
                >> temp_particle_info.x >> temp_particle_info.y
                >> temp_particle_info.z >> temp_particle_info.E
                >> temp_particle_info.px >> temp_particle_info.py
                >> temp_particle_info.pz;

            (*full_particle_list_mixed_event)[ievent]->push_back(
                temp_particle_info);
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}